

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O2

OpenMPClause * __thiscall OpenMPDirective::addOpenMPClause(OpenMPDirective *this,int k,...)

{
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *this_00;
  OpenMPClauseKind OVar1;
  size_type sVar2;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar3;
  ostream *poVar4;
  mapped_type *ppvVar5;
  reference ppOVar6;
  char *in_RCX;
  OpenMPAffinityClauseModifier in_EDX;
  char *in_R8;
  char *in_R9;
  char *in_stack_00000008;
  va_list args;
  OpenMPClauseKind kind;
  OpenMPClause *new_clause;
  allocator<char> local_129;
  string local_128;
  string mapper_identifier;
  OpenMPMapClauseModifier local_d0;
  OpenMPMapClauseModifier local_c8;
  OpenMPMapClauseType local_c0;
  
  this_00 = &this->clauses;
  kind = k;
  sVar2 = std::
          map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
          ::count(this_00,&kind);
  if (sVar2 == 0) {
    mapper_identifier._M_string_length = (size_type)operator_new(0x18);
    *(undefined8 *)mapper_identifier._M_string_length = 0;
    *(undefined8 *)(mapper_identifier._M_string_length + 8) = 0;
    *(undefined8 *)(mapper_identifier._M_string_length + 0x10) = 0;
    mapper_identifier._M_dataplus._M_p._0_4_ = kind;
    std::
    _Rb_tree<OpenMPClauseKind,std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>,std::_Select1st<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>,std::less<OpenMPClauseKind>,std::allocator<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>>
    ::
    _M_emplace_unique<std::pair<OpenMPClauseKind,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>
              ((_Rb_tree<OpenMPClauseKind,std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>,std::_Select1st<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>,std::less<OpenMPClauseKind>,std::allocator<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>>
                *)this_00,
               (pair<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>
                *)&mapper_identifier);
  }
  pvVar3 = getClauses(this,kind);
  OVar1 = kind;
  new_clause = (OpenMPClause *)0x0;
  local_d0 = (OpenMPMapClauseModifier)in_RCX;
  local_c8 = (OpenMPMapClauseModifier)in_R8;
  switch(kind) {
  case OMPC_if:
    if (in_EDX != 0xc) {
      in_RCX = (char *)0x0;
    }
    new_clause = OpenMPIfClause::addIfClause(this,in_EDX,in_RCX);
    break;
  case OMPC_num_threads:
  case OMPC_private:
  case OMPC_firstprivate:
  case OMPC_shared:
  case OMPC_copyin:
  case OMPC_align:
  case OMPC_num_teams:
  case OMPC_thread_limit:
  case OMPC_collapse:
  case OMPC_ordered:
  case OMPC_partial:
  case OMPC_nowait:
  case OMPC_full:
  case OMPC_safelen:
  case OMPC_simdlen:
  case OMPC_nontemporal:
  case OMPC_uniform:
  case OMPC_inbranch:
  case OMPC_notinbranch:
  case OMPC_inclusive:
  case OMPC_exclusive:
  case OMPC_copyprivate:
  case OMPC_parallel:
  case OMPC_sections:
  case OMPC_for:
  case OMPC_do:
  case OMPC_taskgroup:
  case OMPC_final:
  case OMPC_untied:
  case OMPC_mergeable:
  case OMPC_priority:
  case OMPC_detach:
  case OMPC_grainsize:
  case OMPC_num_tasks:
  case OMPC_nogroup:
  case OMPC_reverse_offload:
  case OMPC_unified_address:
  case OMPC_unified_shared_memory:
  case OMPC_dynamic_allocators:
  case OMPC_use_device_ptr:
  case OMPC_sizes:
  case OMPC_use_device_addr:
  case OMPC_is_device_ptr:
  case OMPC_has_device_addr:
  case OMPC_link:
  case OMPC_acq_rel:
  case OMPC_release:
  case OMPC_acquire:
  case OMPC_read:
  case OMPC_write:
  case OMPC_update:
  case OMPC_capture:
  case OMPC_seq_cst:
  case OMPC_relaxed:
  case OMPC_hint:
  case OMPC_destroy:
  case OMPC_threads:
  case OMPC_simd:
    if ((pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      new_clause = (OpenMPClause *)operator_new(0x68);
      (new_clause->super_SourceLocation).line = 0;
      (new_clause->super_SourceLocation).column = 0;
      (new_clause->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
      new_clause->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__0019d2a0;
      new_clause->kind = OVar1;
      new_clause->clause_position = -1;
      (new_clause->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (new_clause->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (new_clause->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (new_clause->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (new_clause->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (new_clause->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (new_clause->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (new_clause->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (new_clause->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar3 = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
      (pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar3,&new_clause);
      ppvVar5 = std::
                map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                ::operator[](this_00,&kind);
      *ppvVar5 = pvVar3;
    }
    else {
      if (kind == OMPC_num_threads) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two num_threads clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_simdlen) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two simdlen clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_safelen) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two safelen clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_seq_cst) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two seq_cst clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_acq_rel) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two acq_rel clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_release) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two release clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_acquire) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two acquire clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_relaxed) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two relaxed clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
      if (kind == OMPC_hint) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two hint clause for the directive ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,kind);
        std::operator<<(poVar4,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        new_clause = *ppOVar6;
      }
    }
    break;
  case OMPC_default:
    new_clause = OpenMPDefaultClause::addDefaultClause(this,in_EDX);
    break;
  case OMPC_reduction:
    if (local_d0 != 0xc) {
      in_R8 = (char *)0x0;
    }
    new_clause = OpenMPReductionClause::addReductionClause(this,in_EDX,local_d0,in_R8);
    break;
  case OMPC_proc_bind:
    new_clause = OpenMPProcBindClause::addProcBindClause(this,in_EDX);
    break;
  case OMPC_allocate:
    if (in_EDX != 8) {
      in_RCX = (char *)0x0;
    }
    new_clause = OpenMPAllocateClause::addAllocateClause(this,in_EDX,in_RCX);
    break;
  case OMPC_lastprivate:
    new_clause = OpenMPLastprivateClause::addLastprivateClause(this,in_EDX);
    break;
  case OMPC_order:
    new_clause = OpenMPOrderClause::addOrderClause(this,in_EDX);
    break;
  case OMPC_linear:
    new_clause = OpenMPLinearClause::addLinearClause(this,in_EDX);
    break;
  case OMPC_schedule:
    if (local_c8 != 5) {
      in_R9 = (char *)0x0;
    }
    new_clause = OpenMPScheduleClause::addScheduleClause(this,in_EDX,local_d0,local_c8,in_R9);
    break;
  case OMPC_aligned:
    new_clause = OpenMPAlignedClause::addAlignedClause(this);
    break;
  case OMPC_dist_schedule:
    new_clause = OpenMPDistScheduleClause::addDistScheduleClause(this,in_EDX);
    break;
  case OMPC_bind:
    new_clause = OpenMPBindClause::addBindClause(this,in_EDX);
    break;
  case OMPC_allocator:
    if (in_EDX != 8) {
      in_RCX = (char *)0x0;
    }
    new_clause = OpenMPAllocatorClause::addAllocatorClause(this,in_EDX,in_RCX);
    break;
  case OMPC_initializer:
    if (in_EDX != OMPC_AFFINITY_MODIFIER_unspecified) {
      in_RCX = (char *)0x0;
    }
    new_clause = OpenMPInitializerClause::addInitializerClause(this,in_EDX,in_RCX);
    break;
  case OMPC_in_reduction:
    if (in_EDX != 0xc) {
      in_RCX = (char *)0x0;
    }
    new_clause = OpenMPInReductionClause::addInReductionClause(this,in_EDX,in_RCX);
    break;
  case OMPC_depend:
    new_clause = OpenMPDependClause::addDependClause(this,in_EDX,local_d0);
    break;
  case OMPC_affinity:
    new_clause = OpenMPAffinityClause::addAffinityClause(this,in_EDX);
    break;
  case OMPC_atomic_default_mem_order:
    new_clause = OpenMPAtomicDefaultMemOrderClause::addAtomicDefaultMemOrderClause(this,in_EDX);
    break;
  case OMPC_ext_implementation_defined_requirement:
    new_clause = OpenMPExtImplementationDefinedRequirementClause::
                 addExtImplementationDefinedRequirementClause(this);
    break;
  case OMPC_device:
    new_clause = OpenMPDeviceClause::addDeviceClause(this,in_EDX);
    break;
  case OMPC_map:
    local_c0 = (OpenMPMapClauseType)in_R9;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mapper_identifier,in_stack_00000008,&local_129);
    std::__cxx11::string::string((string *)&local_128,(string *)&mapper_identifier);
    new_clause = OpenMPMapClause::addMapClause(this,in_EDX,local_d0,local_c8,local_c0,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&mapper_identifier);
    break;
  case OMPC_defaultmap:
    new_clause = OpenMPDefaultmapClause::addDefaultmapClause(this,in_EDX,local_d0);
    break;
  case OMPC_to:
    new_clause = OpenMPToClause::addToClause(this,in_EDX);
    break;
  case OMPC_from:
    new_clause = OpenMPFromClause::addFromClause(this,in_EDX);
    break;
  case OMPC_uses_allocators:
    new_clause = OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(this);
    break;
  case OMPC_when:
    new_clause = OpenMPWhenClause::addWhenClause(this);
    break;
  case OMPC_match:
    new_clause = OpenMPMatchClause::addMatchClause(this);
    break;
  case OMPC_device_type:
    new_clause = OpenMPDeviceTypeClause::addDeviceTypeClause(this,in_EDX);
    break;
  case OMPC_task_reduction:
    if (in_EDX != 0xc) {
      in_RCX = (char *)0x0;
    }
    new_clause = OpenMPTaskReductionClause::addTaskReductionClause(this,in_EDX,in_RCX);
    break;
  case OMPC_depobj_update:
    new_clause = OpenMPDepobjUpdateClause::addDepobjUpdateClause(this,in_EDX);
  }
  if (new_clause == (OpenMPClause *)0x0) {
    new_clause = (OpenMPClause *)0x0;
  }
  else if (new_clause->clause_position == -1) {
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back
              (this->clauses_in_original_order,&new_clause);
    new_clause->clause_position =
         (int)((ulong)((long)(this->clauses_in_original_order->
                             super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->clauses_in_original_order->
                            super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  return new_clause;
}

Assistant:

OpenMPClause * OpenMPDirective::addOpenMPClause(int k, ... ) {

    OpenMPClauseKind kind = (OpenMPClauseKind)k;
    // Check whether the given kind of clause exists first.
    // If not, create an empty vector.
    if (clauses.count(kind) == 0) {
        clauses.insert(std::pair<OpenMPClauseKind, std::vector<OpenMPClause*>*>(kind, new std::vector<OpenMPClause*>));
    };
    std::vector<OpenMPClause*>* current_clauses = getClauses(kind);
    va_list args;
    va_start(args, k);
    OpenMPClause * new_clause = NULL;

    switch (kind) {
        case OMPC_num_threads:
        case OMPC_private:
        case OMPC_firstprivate:
        case OMPC_shared:
        case OMPC_num_teams:
        case OMPC_thread_limit:
        case OMPC_copyin:
        case OMPC_align:
        case OMPC_collapse:
        case OMPC_ordered:
        case OMPC_partial:
        case OMPC_nowait:
        case OMPC_full:
        case OMPC_safelen:
        case OMPC_simdlen:
        case OMPC_nontemporal:
        case OMPC_uniform:
        case OMPC_inbranch:
        case OMPC_notinbranch :
        case OMPC_copyprivate : 
        case OMPC_parallel:    
        case OMPC_sections: 
        case OMPC_for:
        case OMPC_do:
        case OMPC_taskgroup:
        case OMPC_inclusive:
        case OMPC_exclusive:
        case OMPC_use_device_ptr :
        case OMPC_use_device_addr :
        case OMPC_grainsize :
        case OMPC_num_tasks :
        case OMPC_nogroup :
        case OMPC_final :
        case OMPC_untied :
        case OMPC_mergeable :
        case OMPC_priority :
        case OMPC_detach :
        case OMPC_reverse_offload :
        case OMPC_unified_address :
        case OMPC_unified_shared_memory :
        case OMPC_dynamic_allocators :
        case OMPC_is_device_ptr :
        case OMPC_has_device_addr :
        case OMPC_link :
        case OMPC_threads:
        case OMPC_simd:
        case OMPC_acq_rel : 
        case OMPC_seq_cst : 
        case OMPC_release : 
        case OMPC_acquire : 
        case OMPC_relaxed : 
        case OMPC_read : 
        case OMPC_write : 
        case OMPC_update : 
        case OMPC_capture : 
        case OMPC_hint :
        case OMPC_destroy:
        case OMPC_sizes:
        
        {
            if (current_clauses->size() == 0) {
                new_clause = new OpenMPClause(kind);
                current_clauses = new std::vector<OpenMPClause*>();
                current_clauses->push_back(new_clause);
                clauses[kind] = current_clauses;
            } else {
                if (kind == OMPC_num_threads) {
                    std::cerr << "Cannot have two num_threads clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_simdlen) {
                    std::cerr << "Cannot have two simdlen clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_safelen) {
                    std::cerr << "Cannot have two safelen clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_seq_cst) {
                    std::cerr << "Cannot have two seq_cst clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_acq_rel) {
                    std::cerr << "Cannot have two acq_rel clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_release) {
                    std::cerr << "Cannot have two release clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_acquire) {
                    std::cerr << "Cannot have two acquire clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_relaxed) {
                    std::cerr << "Cannot have two relaxed clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_hint) {
                    std::cerr << "Cannot have two hint clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
            }
            break;
        }
        case OMPC_if : {
            OpenMPIfClauseModifier modifier = (OpenMPIfClauseModifier) va_arg(args,int);
            char * user_defined_modifier = NULL;
            if (modifier == OMPC_IF_MODIFIER_user)  user_defined_modifier = va_arg(args, char*);
            new_clause = OpenMPIfClause::addIfClause(this, modifier, user_defined_modifier);
            break;
        }
        case OMPC_default : {
            OpenMPDefaultClauseKind default_kind = (OpenMPDefaultClauseKind) va_arg(args, int);
            new_clause = OpenMPDefaultClause::addDefaultClause(this, default_kind);
            break;
        }
        case OMPC_order : {
            OpenMPOrderClauseKind order_kind = (OpenMPOrderClauseKind) va_arg(args, int);
            new_clause = OpenMPOrderClause::addOrderClause(this, order_kind);
            break;
        }
        case OMPC_ext_implementation_defined_requirement : {
            new_clause = OpenMPExtImplementationDefinedRequirementClause::addExtImplementationDefinedRequirementClause(this);
            break;
        }
        case OMPC_match: {
            new_clause = OpenMPMatchClause::addMatchClause(this);
            break;
        }

        case OMPC_reduction: {
            OpenMPReductionClauseModifier modifier = (OpenMPReductionClauseModifier) va_arg(args, int);
            OpenMPReductionClauseIdentifier identifier = (OpenMPReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPReductionClause::addReductionClause(this, modifier, identifier, user_defined_identifier);
            break;
        }
        case OMPC_proc_bind: {
            OpenMPProcBindClauseKind proc_bind_kind = (OpenMPProcBindClauseKind) va_arg(args, int);
            new_clause = OpenMPProcBindClause::addProcBindClause(this, proc_bind_kind);
            break;
        } 
        case OMPC_uses_allocators: {
            new_clause = OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(this);
            break;
        }
        case OMPC_bind: {
            OpenMPBindClauseBinding bind_binding = (OpenMPBindClauseBinding) va_arg(args, int);
            new_clause = OpenMPBindClause::addBindClause(this, bind_binding);
            break;
        }

        case OMPC_lastprivate: {
            OpenMPLastprivateClauseModifier modifier = (OpenMPLastprivateClauseModifier) va_arg(args,int);
            new_clause = OpenMPLastprivateClause::addLastprivateClause(this, modifier);
            break;
        }

        case OMPC_linear: {
            OpenMPLinearClauseModifier modifier = (OpenMPLinearClauseModifier) va_arg(args,int);
            new_clause = OpenMPLinearClause::addLinearClause(this, modifier);
            break;
        }
        case OMPC_aligned:{
            new_clause = OpenMPAlignedClause::addAlignedClause(this);
            break;
        }
        case OMPC_dist_schedule: {
            OpenMPDistScheduleClauseKind dist_schedule_kind = (OpenMPDistScheduleClauseKind) va_arg(args,int);
            new_clause = OpenMPDistScheduleClause::addDistScheduleClause(this, dist_schedule_kind);
            break;
        }
        case OMPC_schedule: {
            OpenMPScheduleClauseModifier modifier1 = (OpenMPScheduleClauseModifier) va_arg(args, int);
            OpenMPScheduleClauseModifier modifier2 = (OpenMPScheduleClauseModifier) va_arg(args, int);
            OpenMPScheduleClauseKind schedule_kind = (OpenMPScheduleClauseKind) va_arg(args, int);
            char * user_defined_kind = NULL;
            if (schedule_kind == OMPC_SCHEDULE_KIND_user) user_defined_kind = va_arg(args, char *);
            new_clause = OpenMPScheduleClause::addScheduleClause(this, modifier1, modifier2, schedule_kind, user_defined_kind);

            break;
        }
        case OMPC_device : {
            OpenMPDeviceClauseModifier modifier = (OpenMPDeviceClauseModifier) va_arg(args, int);
            new_clause = OpenMPDeviceClause::addDeviceClause(this, modifier);
            break;
}

        case OMPC_initializer:{
            OpenMPInitializerClausePriv priv = (OpenMPInitializerClausePriv) va_arg(args, int);
            char* user_defined_priv = NULL;
            if (priv == OMPC_INITIALIZER_PRIV_user) user_defined_priv = va_arg(args, char *);
            new_clause = OpenMPInitializerClause::addInitializerClause(this, priv, user_defined_priv);
            break;
        }
        case OMPC_allocate : {
            OpenMPAllocateClauseAllocator allocator = (OpenMPAllocateClauseAllocator) va_arg(args, int);
            char* user_defined_allocator = NULL;
            if (allocator == OMPC_ALLOCATE_ALLOCATOR_user) user_defined_allocator = va_arg(args, char *);
            new_clause = OpenMPAllocateClause::addAllocateClause(this, allocator, user_defined_allocator);
            break;
        }
        case OMPC_allocator : {
            OpenMPAllocatorClauseAllocator allocator = (OpenMPAllocatorClauseAllocator) va_arg(args, int);
            char* user_defined_allocator = NULL;
            if (allocator == OMPC_ALLOCATOR_ALLOCATOR_user) user_defined_allocator = va_arg(args, char *);
            new_clause = OpenMPAllocatorClause::addAllocatorClause(this, allocator, user_defined_allocator);
            
            break;
        }
        case OMPC_atomic_default_mem_order : {
            OpenMPAtomicDefaultMemOrderClauseKind atomic_default_mem_order_kind = (OpenMPAtomicDefaultMemOrderClauseKind) va_arg(args, int);
            new_clause = OpenMPAtomicDefaultMemOrderClause::addAtomicDefaultMemOrderClause(this, atomic_default_mem_order_kind);
            
            break;
        }
        case OMPC_in_reduction : {
            OpenMPInReductionClauseIdentifier identifier = (OpenMPInReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_IN_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPInReductionClause::addInReductionClause(this, identifier, user_defined_identifier);
            break;
        }
        case OMPC_depobj_update : {
            OpenMPDepobjUpdateClauseDependeceType type = (OpenMPDepobjUpdateClauseDependeceType) va_arg(args, int);
            new_clause = OpenMPDepobjUpdateClause::addDepobjUpdateClause(this, type);            
            break;
        }
        case OMPC_depend : {
            OpenMPDependClauseModifier modifier = (OpenMPDependClauseModifier) va_arg(args, int);
            OpenMPDependClauseType type = (OpenMPDependClauseType) va_arg(args, int);
            new_clause = OpenMPDependClause::addDependClause(this, modifier, type);
            break;
        }
        case OMPC_affinity : {
            OpenMPAffinityClauseModifier modifier = (OpenMPAffinityClauseModifier) va_arg(args, int);
            new_clause = OpenMPAffinityClause::addAffinityClause(this, modifier);
            break;
        }
        case OMPC_to : {
            OpenMPToClauseKind to_kind = (OpenMPToClauseKind) va_arg(args, int);
            new_clause = OpenMPToClause::addToClause(this, to_kind);
            break;
        }
        case OMPC_from : {
            OpenMPFromClauseKind from_kind = (OpenMPFromClauseKind) va_arg(args, int);
            new_clause = OpenMPFromClause::addFromClause(this, from_kind);
            break;
        }

        case OMPC_device_type : {
            OpenMPDeviceTypeClauseKind device_type_kind = (OpenMPDeviceTypeClauseKind) va_arg(args, int);
            new_clause = OpenMPDeviceTypeClause::addDeviceTypeClause(this, device_type_kind);
            break;
        }
 
        case OMPC_defaultmap : {
            OpenMPDefaultmapClauseBehavior behavior = (OpenMPDefaultmapClauseBehavior) va_arg(args,int);
            OpenMPDefaultmapClauseCategory category = (OpenMPDefaultmapClauseCategory) va_arg(args,int);
            new_clause = OpenMPDefaultmapClause::addDefaultmapClause(this, behavior, category);
            break;        
        }
        case OMPC_task_reduction : {
            OpenMPTaskReductionClauseIdentifier identifier = (OpenMPTaskReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_TASK_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPTaskReductionClause::addTaskReductionClause(this, identifier, user_defined_identifier);
            break;
        }
        case OMPC_map: {
            OpenMPMapClauseModifier modifier1 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseModifier modifier2 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseModifier modifier3 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseType type = (OpenMPMapClauseType)va_arg(args, int);
            std::string mapper_identifier = (std::string)va_arg(args, char*);
            new_clause = OpenMPMapClause::addMapClause(this, modifier1, modifier2, modifier3, type, mapper_identifier);
            break;
        }
        case OMPC_when: {
            new_clause = OpenMPWhenClause::addWhenClause(this);
            break;
        }
        default: {
            ;
        }
    };

    va_end(args);
    if (new_clause != NULL && new_clause->getClausePosition() == -1) {
        this->getClausesInOriginalOrder()->push_back(new_clause);
        new_clause->setClausePosition(this->getClausesInOriginalOrder()->size()-1);
    };
    return new_clause;
}